

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,VmBlock *argument)

{
  Allocator *allocator;
  RegVmLoweredInstruction *this_00;
  VmConstant *local_78;
  uchar rB_local;
  uchar rA_local;
  RegVmInstructionCode code_local;
  SynBase *location_local;
  ExpressionContext *ctx_local;
  RegVmLoweredBlock *this_local;
  
  this_00 = ExpressionContext::get<RegVmLoweredInstruction>(ctx);
  allocator = ctx->allocator;
  if (argument == (VmBlock *)0x0) {
    local_78 = (VmConstant *)0x0;
  }
  else {
    local_78 = CreateConstantBlock(ctx->allocator,(SynBase *)0x0,argument);
  }
  RegVmLoweredInstruction::RegVmLoweredInstruction
            (this_00,allocator,location,code,rA,rB,rC,local_78);
  AddInstruction(this,ctx,this_00);
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, VmBlock *argument)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, argument ? CreateConstantBlock(ctx.allocator, NULL, argument) : NULL));
}